

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

InstanceSymbol *
slang::ast::InstanceSymbol::createVirtual
          (ASTContext *context,SourceLocation loc,DefinitionSymbol *definition,
          ParameterValueAssignmentSyntax *paramAssignments)

{
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  string_view definitionName;
  Compilation *args_3;
  InstanceSymbol *this;
  Scope *scope;
  long in_RCX;
  long in_RDX;
  ASTContext *in_RDI;
  InstanceSymbol *result;
  Compilation *comp;
  ParameterBuilder paramBuilder;
  undefined1 in_stack_0000049f;
  ParameterValueAssignmentSyntax *in_stack_000004a0;
  ParameterBuilder *in_stack_000004a8;
  Scope *in_stack_fffffffffffffdb8;
  ParameterBuilder *in_stack_fffffffffffffdc0;
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *in_stack_fffffffffffffdc8;
  InstanceSymbol *pIVar1;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdd0;
  size_t in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  ParameterBuilder *in_stack_fffffffffffffe08;
  SourceLocation *in_stack_fffffffffffffe18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe20;
  Compilation *in_stack_fffffffffffffe28;
  BumpAllocator *in_stack_fffffffffffffe30;
  InstanceFlags *args_5;
  ParameterBuilder local_1b8;
  long local_20;
  long local_18;
  ASTContext *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RDI;
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0xfbe1a4);
  args_5 = *(InstanceFlags **)(local_18 + 0x10);
  std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>::
  span<const_slang::SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL>_&>
            ((span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> *)
             in_stack_fffffffffffffdd0._M_extent_value,in_stack_fffffffffffffdc8);
  definitionName._M_str = in_stack_fffffffffffffde0;
  definitionName._M_len = in_stack_fffffffffffffdd8;
  parameterDecls._M_extent._M_extent_value = in_stack_fffffffffffffdd0._M_extent_value;
  parameterDecls._M_ptr = (pointer)in_stack_fffffffffffffdc8;
  ParameterBuilder::ParameterBuilder
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,definitionName,parameterDecls);
  ParameterBuilder::setInstanceContext(&local_1b8,local_10);
  if (local_20 != 0) {
    ParameterBuilder::setAssignments(in_stack_000004a8,in_stack_000004a0,(bool)in_stack_0000049f);
  }
  args_3 = ASTContext::getCompilation((ASTContext *)0xfbe26b);
  this = BumpAllocator::
         emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::DefinitionSymbol_const&,slang::ast::ParameterBuilder&,slang::ast::InstanceFlags>
                   (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe18,(DefinitionSymbol *)args_3,in_stack_fffffffffffffe08,
                    args_5);
  pIVar1 = this;
  scope = not_null<const_slang::ast::Scope_*>::operator*
                    ((not_null<const_slang::ast::Scope_*> *)0xfbe2e0);
  Symbol::setParent((Symbol *)this,scope);
  ParameterBuilder::~ParameterBuilder((ParameterBuilder *)0xfbe30f);
  return pIVar1;
}

Assistant:

InstanceSymbol& InstanceSymbol::createVirtual(
    const ASTContext& context, SourceLocation loc, const DefinitionSymbol& definition,
    const ParameterValueAssignmentSyntax* paramAssignments) {

    ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
    paramBuilder.setInstanceContext(context);
    if (paramAssignments)
        paramBuilder.setAssignments(*paramAssignments, /* isFromConfig */ false);

    auto& comp = context.getCompilation();
    auto& result = *comp.emplace<InstanceSymbol>(comp, definition.name, loc, definition,
                                                 paramBuilder, InstanceFlags::None);

    // Set the parent pointer so that traversing upwards still works to find
    // the instantiation scope. This "virtual" instance never actually gets
    // added to the scope the proper way as a member.
    result.setParent(*context.scope);
    return result;
}